

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O1

void __thiscall irr::scene::CMeshSceneNode::setMesh(CMeshSceneNode *this,IMesh *mesh)

{
  int *piVar1;
  IMesh *pIVar2;
  _func_int *p_Var3;
  
  if (mesh != (IMesh *)0x0) {
    *(int *)(&mesh->field_0x10 + (long)mesh->_vptr_IMesh[-3]) =
         *(int *)(&mesh->field_0x10 + (long)mesh->_vptr_IMesh[-3]) + 1;
    pIVar2 = this->Mesh;
    if (pIVar2 != (IMesh *)0x0) {
      p_Var3 = pIVar2->_vptr_IMesh[-3];
      piVar1 = (int *)(&pIVar2->field_0x10 + (long)p_Var3);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)((long)&pIVar2->_vptr_IMesh + (long)p_Var3) + 8))();
      }
    }
    this->Mesh = mesh;
    copyMaterials(this);
    return;
  }
  return;
}

Assistant:

void CMeshSceneNode::setMesh(IMesh *mesh)
{
	if (mesh) {
		mesh->grab();
		if (Mesh)
			Mesh->drop();

		Mesh = mesh;
		copyMaterials();
	}
}